

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  __pid_t child_pid_00;
  internal *this_00;
  ostream *poVar4;
  int *piVar5;
  UnitTestImpl *this_01;
  TestEventListeners *this_02;
  size_t thread_count_00;
  long in_FS_OFFSET;
  int gtest_retval_1;
  int gtest_retval;
  pid_t child_pid;
  size_t thread_count;
  NoExecDeathTest *this_local;
  allocator<char> local_435;
  int local_434;
  allocator<char> local_42d;
  int local_42c;
  allocator<char> local_426;
  allocator<char> local_425;
  int local_424;
  allocator<char> local_41d;
  GTestLog local_41c;
  string local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_38;
  int local_34;
  int pipe_fd [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (internal *)GetThreadCount();
  if (this_00 != (internal *)0x1) {
    GTestLog::GTestLog(&local_41c,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                       ,0x41a);
    poVar4 = GTestLog::GetStream(&local_41c);
    DeathTestThreadWarning_abi_cxx11_((string *)pipe_fd,this_00,thread_count_00);
    std::operator<<(poVar4,(string *)pipe_fd);
    std::__cxx11::string::~string((string *)pipe_fd);
    GTestLog::~GTestLog(&local_41c);
  }
  do {
    iVar3 = pipe(&local_38);
    bVar2 = IsTrue(iVar3 != -1);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"CHECK failed: File ",&local_41d);
      std::operator+(&local_d8,&local_f8,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_b8,&local_d8,", line ");
      local_424 = 0x41e;
      StreamableToString<int>(&local_118,&local_424);
      std::operator+(&local_98,&local_b8,&local_118);
      std::operator+(&local_78,&local_98,": ");
      std::operator+(&local_58,&local_78,"pipe(pipe_fd) != -1");
      DeathTestAbort(&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator(&local_41d);
    }
    bVar2 = AlwaysFalse();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"",&local_425);
  DeathTest::set_last_death_test_message(&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_425);
  CaptureStderr();
  FlushInfoLog();
  child_pid_00 = fork();
  do {
    bVar2 = IsTrue(child_pid_00 != -1);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"CHECK failed: File ",&local_426);
      std::operator+(&local_1d8,&local_1f8,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_1b8,&local_1d8,", line ");
      local_42c = 0x42c;
      StreamableToString<int>(&local_218,&local_42c);
      std::operator+(&local_198,&local_1b8,&local_218);
      std::operator+(&local_178,&local_198,": ");
      std::operator+(&local_158,&local_178,"child_pid != -1");
      DeathTestAbort(&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_426);
    }
    bVar2 = AlwaysFalse();
  } while (bVar2);
  ForkingDeathTest::set_child_pid(&this->super_ForkingDeathTest,child_pid_00);
  if (child_pid_00 == 0) {
    do {
      do {
        iVar3 = close(local_38);
        bVar2 = false;
        if (iVar3 == -1) {
          piVar5 = __errno_location();
          bVar2 = *piVar5 == 4;
        }
      } while (bVar2);
      if (iVar3 == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,"CHECK failed: File ",&local_42d);
        std::operator+(&local_2d8,&local_2f8,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_2b8,&local_2d8,", line ");
        local_434 = 0x42f;
        StreamableToString<int>(&local_318,&local_434);
        std::operator+(&local_298,&local_2b8,&local_318);
        std::operator+(&local_278,&local_298,": ");
        std::operator+(&local_258,&local_278,"close(pipe_fd[0])");
        std::operator+(&local_238,&local_258," != -1");
        DeathTestAbort(&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::allocator<char>::~allocator(&local_42d);
      }
      bVar2 = AlwaysFalse();
    } while (bVar2);
    DeathTestImpl::set_write_fd((DeathTestImpl *)this,local_34);
    LogToStderr();
    this_01 = GetUnitTestImpl();
    this_02 = UnitTestImpl::listeners(this_01);
    TestEventListeners::SuppressEventForwarding(this_02);
    g_in_fast_death_test_child = 1;
    this_local._0_4_ = EXECUTE_TEST;
  }
  else {
    do {
      do {
        iVar3 = close(local_34);
        bVar2 = false;
        if (iVar3 == -1) {
          piVar5 = __errno_location();
          bVar2 = *piVar5 == 4;
        }
      } while (bVar2);
      if (iVar3 == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f8,"CHECK failed: File ",&local_435);
        std::operator+(&local_3d8,&local_3f8,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_3b8,&local_3d8,", line ");
        this_local._4_4_ = 0x43b;
        StreamableToString<int>(&local_418,(int *)((long)&this_local + 4));
        std::operator+(&local_398,&local_3b8,&local_418);
        std::operator+(&local_378,&local_398,": ");
        std::operator+(&local_358,&local_378,"close(pipe_fd[1])");
        std::operator+(&local_338,&local_358," != -1");
        DeathTestAbort(&local_338);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::allocator<char>::~allocator(&local_435);
      }
      bVar2 = AlwaysFalse();
    } while (bVar2);
    DeathTestImpl::set_read_fd((DeathTestImpl *)this,local_38);
    DeathTestImpl::set_spawned((DeathTestImpl *)this,true);
    this_local._0_4_ = OVERSEE_TEST;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (TestRole)this_local;
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}